

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O1

string * __thiscall
polyscope::SurfaceFaceTangentVectorQuantity::niceName_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceFaceTangentVectorQuantity *this)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  uint __val;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  uint uVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if ((this->super_TangentVectorQuantity<polyscope::SurfaceFaceTangentVectorQuantity>).nSym == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *(long *)&(this->super_SurfaceVectorQuantity).field_0x148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar3,
               *(long *)&(this->super_SurfaceVectorQuantity).field_0x150 + lVar3);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  lVar3 = *(long *)&(this->super_SurfaceVectorQuantity).field_0x148;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar3,
             *(long *)&(this->super_SurfaceVectorQuantity).field_0x150 + lVar3);
  std::__cxx11::string::append((char *)&local_50);
  uVar2 = (this->super_TangentVectorQuantity<polyscope::SurfaceFaceTangentVectorQuantity>).nSym;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00252da2;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00252da2;
      }
      if (uVar7 < 10000) goto LAB_00252da2;
      uVar9 = uVar9 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00252da2:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_70),__len,__val);
  uVar9 = 0xf;
  if (local_50 != local_40) {
    uVar9 = local_40[0];
  }
  if (uVar9 < (ulong)(local_68 + local_48)) {
    uVar9 = 0xf;
    if (local_70 != local_60) {
      uVar9 = local_60[0];
    }
    if ((ulong)(local_68 + local_48) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      goto LAB_00252e30;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
LAB_00252e30:
  local_90 = &local_80;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceFaceTangentVectorQuantity::niceName() {
  if (nSym == 1) {
    return name + " (face tangent vector)";
  } else {
    return name + " (face tangent vector sym=" + std::to_string(nSym) + ")";
  }
}